

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSampleImages.cpp
# Opt level: O2

void anon_unknown.dwarf_22bcf9::compareImages(char *fileName1,char *fileName2)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  Box2i *pBVar4;
  Box2i *src;
  ulong uVar5;
  size_t yStride;
  long lVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  float fVar10;
  Array<Imf_2_5::Rgba> pixels2;
  Array<Imf_2_5::Rgba> pixels1;
  RgbaInputFile in1;
  RgbaInputFile in2;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"comparing files ");
  poVar3 = std::operator<<(poVar3,fileName1);
  poVar3 = std::operator<<(poVar3," and ");
  poVar3 = std::operator<<(poVar3,fileName2);
  std::endl<char,std::char_traits<char>>(poVar3);
  iVar2 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaInputFile::RgbaInputFile(&in1,fileName1,iVar2);
  iVar2 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaInputFile::RgbaInputFile(&in2,fileName1,iVar2);
  pBVar4 = Imf_2_5::RgbaInputFile::dataWindow(&in1);
  src = Imf_2_5::RgbaInputFile::dataWindow(&in2);
  bVar1 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==(pBVar4,src);
  if (!bVar1) {
    __assert_fail("in1.dataWindow() == in2.dataWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testSampleImages.cpp"
                  ,0x6d,"void (anonymous namespace)::compareImages(const char *, const char *)");
  }
  pBVar4 = Imf_2_5::RgbaInputFile::dataWindow(&in1);
  lVar6 = (long)(pBVar4->min).x;
  yStride = ((pBVar4->max).x - lVar6) + 1;
  iVar2 = (pBVar4->min).y;
  uVar8 = (((pBVar4->max).y - iVar2) + 1) * (int)yStride;
  Imf_2_5::Array<Imf_2_5::Rgba>::Array(&pixels1,(long)(int)uVar8);
  Imf_2_5::Array<Imf_2_5::Rgba>::Array(&pixels2,(long)(int)uVar8);
  lVar7 = (long)(iVar2 * (int)yStride);
  Imf_2_5::RgbaInputFile::setFrameBuffer(&in1,pixels1._data + (-lVar6 - lVar7),1,yStride);
  Imf_2_5::RgbaInputFile::setFrameBuffer(&in2,pixels2._data + (-lVar6 - lVar7),1,yStride);
  pBVar4 = Imf_2_5::RgbaInputFile::dataWindow(&in1);
  iVar2 = (pBVar4->min).y;
  pBVar4 = Imf_2_5::RgbaInputFile::dataWindow(&in1);
  Imf_2_5::RgbaInputFile::readPixels(&in1,iVar2,(pBVar4->max).y);
  pBVar4 = Imf_2_5::RgbaInputFile::dataWindow(&in2);
  iVar2 = (pBVar4->min).y;
  pBVar4 = Imf_2_5::RgbaInputFile::dataWindow(&in2);
  Imf_2_5::RgbaInputFile::readPixels(&in2,iVar2,(pBVar4->max).y);
  uVar5 = 0;
  uVar9 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar9 = uVar5;
  }
  while( true ) {
    if (uVar9 == uVar5) {
      Imf_2_5::Array<Imf_2_5::Rgba>::~Array(&pixels2);
      Imf_2_5::Array<Imf_2_5::Rgba>::~Array(&pixels1);
      Imf_2_5::RgbaInputFile::~RgbaInputFile(&in2);
      Imf_2_5::RgbaInputFile::~RgbaInputFile(&in1);
      return;
    }
    fVar10 = (*(float *)((long)&half::_toFloat + (ulong)pixels1._data[uVar5].r._h * 4) + 0.01) /
             (*(float *)((long)&half::_toFloat + (ulong)pixels2._data[uVar5].r._h * 4) + 0.01);
    if ((fVar10 < 0.99) || (1.01 < fVar10)) {
      __assert_fail("approximatelyEqual (pixels1[i].r, pixels2[i].r)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testSampleImages.cpp"
                    ,0x81,"void (anonymous namespace)::compareImages(const char *, const char *)");
    }
    fVar10 = (*(float *)((long)&half::_toFloat + (ulong)pixels1._data[uVar5].g._h * 4) + 0.01) /
             (*(float *)((long)&half::_toFloat + (ulong)pixels2._data[uVar5].g._h * 4) + 0.01);
    if ((fVar10 < 0.99) || (1.01 < fVar10)) {
      __assert_fail("approximatelyEqual (pixels1[i].g, pixels2[i].g)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testSampleImages.cpp"
                    ,0x82,"void (anonymous namespace)::compareImages(const char *, const char *)");
    }
    fVar10 = (*(float *)((long)&half::_toFloat + (ulong)pixels1._data[uVar5].b._h * 4) + 0.01) /
             (*(float *)((long)&half::_toFloat + (ulong)pixels2._data[uVar5].b._h * 4) + 0.01);
    if ((fVar10 < 0.99) || (1.01 < fVar10)) break;
    fVar10 = (*(float *)((long)&half::_toFloat + (ulong)pixels1._data[uVar5].a._h * 4) + 0.01) /
             (*(float *)((long)&half::_toFloat + (ulong)pixels2._data[uVar5].a._h * 4) + 0.01);
    if ((fVar10 < 0.99) || (uVar5 = uVar5 + 1, 1.01 < fVar10)) {
      __assert_fail("approximatelyEqual (pixels1[i].a, pixels2[i].a)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testSampleImages.cpp"
                    ,0x84,"void (anonymous namespace)::compareImages(const char *, const char *)");
    }
  }
  __assert_fail("approximatelyEqual (pixels1[i].b, pixels2[i].b)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testSampleImages.cpp"
                ,0x83,"void (anonymous namespace)::compareImages(const char *, const char *)");
}

Assistant:

void
compareImages (const char fileName1[], const char fileName2[])
{
    cout << "comparing files " << fileName1 << " and " << fileName2 << endl;

    OPENEXR_IMF_NAMESPACE::RgbaInputFile in1 (fileName1);
    OPENEXR_IMF_NAMESPACE::RgbaInputFile in2 (fileName1);

    assert (in1.dataWindow() == in2.dataWindow());

    const Box2i &dw = in1.dataWindow();

    int w = dw.max.x - dw.min.x + 1;
    int h = dw.max.y - dw.min.y + 1;
    int dx = dw.min.x;
    int dy = dw.min.y;

    Array<OPENEXR_IMF_NAMESPACE::Rgba> pixels1 (w * h);
    Array<OPENEXR_IMF_NAMESPACE::Rgba> pixels2 (w * h);

    in1.setFrameBuffer (pixels1 - dx - dy * w, 1, w);
    in2.setFrameBuffer (pixels2 - dx - dy * w, 1, w);

    in1.readPixels (in1.dataWindow().min.y, in1.dataWindow().max.y);
    in2.readPixels (in2.dataWindow().min.y, in2.dataWindow().max.y);

    for (int i = 0; i < w * h; ++i)
    {
	assert (approximatelyEqual (pixels1[i].r, pixels2[i].r));
	assert (approximatelyEqual (pixels1[i].g, pixels2[i].g));
	assert (approximatelyEqual (pixels1[i].b, pixels2[i].b));
	assert (approximatelyEqual (pixels1[i].a, pixels2[i].a));
    }
}